

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O3

Tcl_Obj * tclpkcs11_pkcs11_error(CK_RV errorCode)

{
  Tcl_Obj *pTVar1;
  char *pcVar2;
  
  if (0x9f < (long)errorCode) {
    if ((long)errorCode < 0xf0) {
      if ((long)errorCode < 0xd0) {
        switch(errorCode) {
        case 0xa0:
          pcVar2 = "PKCS11_ERROR PIN_INCORRECT";
          break;
        case 0xa1:
          pcVar2 = "PKCS11_ERROR PIN_INVALID";
          break;
        case 0xa2:
          pcVar2 = "PKCS11_ERROR PIN_LEN_RANGE";
          break;
        case 0xa3:
          pcVar2 = "PKCS11_ERROR PIN_EXPIRED";
          break;
        case 0xa4:
          pcVar2 = "PKCS11_ERROR PIN_LOCKED";
          break;
        default:
          goto switchD_0010931c_caseD_f3;
        case 0xb0:
          pcVar2 = "PKCS11_ERROR SESSION_CLOSED";
          break;
        case 0xb1:
          pcVar2 = "PKCS11_ERROR SESSION_COUNT";
          break;
        case 0xb3:
          pcVar2 = "PKCS11_ERROR SESSION_HANDLE_INVALID";
          break;
        case 0xb4:
          pcVar2 = "PKCS11_ERROR SESSION_PARALLEL_NOT_SUPPORTED";
          break;
        case 0xb5:
          pcVar2 = "PKCS11_ERROR SESSION_READ_ONLY";
          break;
        case 0xb6:
          pcVar2 = "PKCS11_ERROR SESSION_EXISTS";
          break;
        case 0xb7:
          pcVar2 = "PKCS11_ERROR SESSION_READ_ONLY_EXISTS";
          break;
        case 0xb8:
          pcVar2 = "PKCS11_ERROR SESSION_READ_WRITE_SO_EXISTS";
          break;
        case 0xc0:
          pcVar2 = "PKCS11_ERROR SIGNATURE_INVALID";
          break;
        case 0xc1:
          pcVar2 = "PKCS11_ERROR SIGNATURE_LEN_RANGE";
        }
        goto LAB_0010988e;
      }
      if ((long)errorCode < 0xe0) {
        if (errorCode == 0xd0) {
          pcVar2 = "PKCS11_ERROR TEMPLATE_INCOMPLETE";
          goto LAB_0010988e;
        }
        if (errorCode == 0xd1) {
          pcVar2 = "PKCS11_ERROR TEMPLATE_INCONSISTENT";
          goto LAB_0010988e;
        }
      }
      else {
        if (errorCode == 0xe0) {
          pcVar2 = "PKCS11_ERROR TOKEN_NOT_PRESENT";
          goto LAB_0010988e;
        }
        if (errorCode == 0xe1) {
          pcVar2 = "PKCS11_ERROR TOKEN_NOT_RECOGNIZED";
          goto LAB_0010988e;
        }
        if (errorCode == 0xe2) {
          pcVar2 = "PKCS11_ERROR TOKEN_WRITE_PROTECTED";
          goto LAB_0010988e;
        }
      }
    }
    else {
      if ((long)errorCode < 0x120) {
        switch(errorCode) {
        case 0xf0:
          pcVar2 = "PKCS11_ERROR UNWRAPPING_KEY_HANDLE_INVALID";
          break;
        case 0xf1:
          pcVar2 = "PKCS11_ERROR UNWRAPPING_KEY_SIZE_RANGE";
          break;
        case 0xf2:
          pcVar2 = "PKCS11_ERROR UNWRAPPING_KEY_TYPE_INCONSISTENT";
          break;
        case 0xf3:
        case 0xf4:
        case 0xf5:
        case 0xf6:
        case 0xf7:
        case 0xf8:
        case 0xf9:
        case 0xfa:
        case 0xfb:
        case 0xfc:
        case 0xfd:
        case 0xfe:
        case 0xff:
          goto switchD_0010931c_caseD_f3;
        case 0x100:
          pcVar2 = "PKCS11_ERROR USER_ALREADY_LOGGED_IN";
          break;
        case 0x101:
          pcVar2 = "PKCS11_ERROR USER_NOT_LOGGED_IN";
          break;
        case 0x102:
          pcVar2 = "PKCS11_ERROR USER_PIN_NOT_INITIALIZED";
          break;
        case 0x103:
          pcVar2 = "PKCS11_ERROR USER_TYPE_INVALID";
          break;
        case 0x104:
          pcVar2 = "PKCS11_ERROR USER_ANOTHER_ALREADY_LOGGED_IN";
          break;
        case 0x105:
          pcVar2 = "PKCS11_ERROR USER_TOO_MANY_TYPES";
          break;
        default:
          switch(errorCode) {
          case 0x110:
            pcVar2 = "PKCS11_ERROR WRAPPED_KEY_INVALID";
            break;
          default:
            goto switchD_0010931c_caseD_f3;
          case 0x112:
            pcVar2 = "PKCS11_ERROR WRAPPED_KEY_LEN_RANGE";
            break;
          case 0x113:
            pcVar2 = "PKCS11_ERROR WRAPPING_KEY_HANDLE_INVALID";
            break;
          case 0x114:
            pcVar2 = "PKCS11_ERROR WRAPPING_KEY_SIZE_RANGE";
            break;
          case 0x115:
            pcVar2 = "PKCS11_ERROR WRAPPING_KEY_TYPE_INCONSISTENT";
          }
        }
        goto LAB_0010988e;
      }
      if ((long)errorCode < 400) {
        if ((long)errorCode < 0x150) {
          if (errorCode == 0x120) {
            pcVar2 = "PKCS11_ERROR RANDOM_SEED_NOT_SUPPORTED";
            goto LAB_0010988e;
          }
          if (errorCode == 0x121) {
            pcVar2 = "PKCS11_ERROR RANDOM_NO_RNG";
            goto LAB_0010988e;
          }
          if (errorCode == 0x130) {
            pcVar2 = "PKCS11_ERROR DOMAIN_PARAMS_INVALID";
            goto LAB_0010988e;
          }
        }
        else if ((long)errorCode < 0x170) {
          if (errorCode == 0x150) {
            pcVar2 = "PKCS11_ERROR BUFFER_TOO_SMALL";
            goto LAB_0010988e;
          }
          if (errorCode == 0x160) {
            pcVar2 = "PKCS11_ERROR SAVED_STATE_INVALID";
            goto LAB_0010988e;
          }
        }
        else {
          if (errorCode == 0x170) {
            pcVar2 = "PKCS11_ERROR INFORMATION_SENSITIVE";
            goto LAB_0010988e;
          }
          if (errorCode == 0x180) {
            pcVar2 = "PKCS11_ERROR STATE_UNSAVEABLE";
            goto LAB_0010988e;
          }
        }
      }
      else if ((long)errorCode < 0x1b0) {
        if ((long)errorCode < 0x1a0) {
          if (errorCode == 400) {
            pcVar2 = "PKCS11_ERROR CRYPTOKI_NOT_INITIALIZED";
            goto LAB_0010988e;
          }
          if (errorCode == 0x191) {
            pcVar2 = "PKCS11_ERROR CRYPTOKI_ALREADY_INITIALIZED";
            goto LAB_0010988e;
          }
        }
        else {
          if (errorCode == 0x1a0) {
            pcVar2 = "PKCS11_ERROR MUTEX_BAD";
            goto LAB_0010988e;
          }
          if (errorCode == 0x1a1) {
            pcVar2 = "PKCS11_ERROR MUTEX_NOT_LOCKED";
            goto LAB_0010988e;
          }
        }
      }
      else if ((long)errorCode < 0x200) {
        if (errorCode == 0x1b0) {
          pcVar2 = "PKCS11_ERROR NEW_PIN_MODE";
          goto LAB_0010988e;
        }
        if (errorCode == 0x1b1) {
          pcVar2 = "PKCS11_ERROR NEXT_OTP";
          goto LAB_0010988e;
        }
      }
      else {
        if (errorCode == 0x200) {
          pcVar2 = "PKCS11_ERROR FUNCTION_REJECTED";
          goto LAB_0010988e;
        }
        if (errorCode == 0x80000000) {
          pcVar2 = "PKCS11_ERROR VENDOR_DEFINED";
          goto LAB_0010988e;
        }
      }
    }
    goto switchD_0010931c_caseD_f3;
  }
  if ((long)errorCode < 0x41) {
    if ((long)errorCode < 0x30) {
      switch(errorCode) {
      case 0:
        pcVar2 = "PKCS11_OK OK";
        break;
      case 1:
        pcVar2 = "PKCS11_ERROR CANCEL";
        break;
      case 2:
        pcVar2 = "PKCS11_ERROR HOST_MEMORY";
        break;
      case 3:
        pcVar2 = "PKCS11_ERROR SLOT_ID_INVALID";
        break;
      default:
        goto switchD_0010931c_caseD_f3;
      case 5:
        pcVar2 = "PKCS11_ERROR GENERAL_ERROR";
        break;
      case 6:
        pcVar2 = "PKCS11_ERROR FUNCTION_FAILED";
        break;
      case 7:
        pcVar2 = "PKCS11_ERROR ARGUMENTS_BAD";
        break;
      case 8:
        pcVar2 = "PKCS11_ERROR NO_EVENT";
        break;
      case 9:
        pcVar2 = "PKCS11_ERROR NEED_TO_CREATE_THREADS";
        break;
      case 10:
        pcVar2 = "PKCS11_ERROR CANT_LOCK";
        break;
      case 0x10:
        pcVar2 = "PKCS11_ERROR ATTRIBUTE_READ_ONLY";
        break;
      case 0x11:
        pcVar2 = "PKCS11_ERROR ATTRIBUTE_SENSITIVE";
        break;
      case 0x12:
        pcVar2 = "PKCS11_ERROR ATTRIBUTE_TYPE_INVALID";
        break;
      case 0x13:
        pcVar2 = "PKCS11_ERROR ATTRIBUTE_VALUE_INVALID";
        break;
      case 0x20:
        pcVar2 = "PKCS11_ERROR DATA_INVALID";
        break;
      case 0x21:
        pcVar2 = "PKCS11_ERROR DATA_LEN_RANGE";
      }
      goto LAB_0010988e;
    }
    if ((long)errorCode < 0x32) {
      if (errorCode == 0x30) {
        pcVar2 = "PKCS11_ERROR DEVICE_ERROR";
        goto LAB_0010988e;
      }
      if (errorCode == 0x31) {
        pcVar2 = "PKCS11_ERROR DEVICE_MEMORY";
        goto LAB_0010988e;
      }
    }
    else {
      if (errorCode == 0x32) {
        pcVar2 = "PKCS11_ERROR DEVICE_REMOVED";
        goto LAB_0010988e;
      }
      if (errorCode == 0x40) {
        pcVar2 = "PKCS11_ERROR ENCRYPTED_DATA_INVALID";
        goto LAB_0010988e;
      }
    }
    goto switchD_0010931c_caseD_f3;
  }
  if (0x81 < (long)errorCode) {
    if (errorCode == 0x82) {
      pcVar2 = "PKCS11_ERROR OBJECT_HANDLE_INVALID";
      goto LAB_0010988e;
    }
    if (errorCode == 0x90) {
      pcVar2 = "PKCS11_ERROR OPERATION_ACTIVE";
      goto LAB_0010988e;
    }
    if (errorCode == 0x91) {
      pcVar2 = "PKCS11_ERROR OPERATION_NOT_INITIALIZED";
      goto LAB_0010988e;
    }
    goto switchD_0010931c_caseD_f3;
  }
  switch(errorCode) {
  case 0x50:
    pcVar2 = "PKCS11_ERROR FUNCTION_CANCELED";
    break;
  case 0x51:
    pcVar2 = "PKCS11_ERROR FUNCTION_NOT_PARALLEL";
    break;
  case 0x54:
    pcVar2 = "PKCS11_ERROR FUNCTION_NOT_SUPPORTED";
    break;
  case 0x60:
    pcVar2 = "PKCS11_ERROR KEY_HANDLE_INVALID";
    break;
  case 0x62:
    pcVar2 = "PKCS11_ERROR KEY_SIZE_RANGE";
    break;
  case 99:
    pcVar2 = "PKCS11_ERROR KEY_TYPE_INCONSISTENT";
    break;
  case 100:
    pcVar2 = "PKCS11_ERROR KEY_NOT_NEEDED";
    break;
  case 0x65:
    pcVar2 = "PKCS11_ERROR KEY_CHANGED";
    break;
  case 0x66:
    pcVar2 = "PKCS11_ERROR KEY_NEEDED";
    break;
  case 0x67:
    pcVar2 = "PKCS11_ERROR KEY_INDIGESTIBLE";
    break;
  case 0x68:
    pcVar2 = "PKCS11_ERROR KEY_FUNCTION_NOT_PERMITTED";
    break;
  case 0x69:
    pcVar2 = "PKCS11_ERROR KEY_NOT_WRAPPABLE";
    break;
  case 0x6a:
    pcVar2 = "PKCS11_ERROR KEY_UNEXTRACTABLE";
    break;
  case 0x70:
    pcVar2 = "PKCS11_ERROR MECHANISM_INVALID";
    break;
  case 0x71:
    pcVar2 = "PKCS11_ERROR MECHANISM_PARAM_INVALID";
    break;
  default:
    if (errorCode == 0x41) {
      pcVar2 = "PKCS11_ERROR ENCRYPTED_DATA_LEN_RANGE";
      break;
    }
  case 0x52:
  case 0x53:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x61:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
switchD_0010931c_caseD_f3:
    pcVar2 = "PKCS11_ERROR UNKNOWN";
  }
LAB_0010988e:
  pTVar1 = (*tclStubsPtr->tcl_NewStringObj)(pcVar2,-1);
  return pTVar1;
}

Assistant:

MODULE_SCOPE Tcl_Obj *tclpkcs11_pkcs11_error(CK_RV errorCode) {
  switch (errorCode) {
    case CKR_OK:
      return(Tcl_NewStringObj("PKCS11_OK OK", -1));
    case CKR_CANCEL:
      return(Tcl_NewStringObj("PKCS11_ERROR CANCEL", -1));
    case CKR_HOST_MEMORY:
      return(Tcl_NewStringObj("PKCS11_ERROR HOST_MEMORY", -1));
    case CKR_SLOT_ID_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SLOT_ID_INVALID", -1));
    case CKR_GENERAL_ERROR:
      return(Tcl_NewStringObj("PKCS11_ERROR GENERAL_ERROR", -1));
    case CKR_FUNCTION_FAILED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_FAILED", -1));
    case CKR_ARGUMENTS_BAD:
      return(Tcl_NewStringObj("PKCS11_ERROR ARGUMENTS_BAD", -1));
    case CKR_NO_EVENT:
      return(Tcl_NewStringObj("PKCS11_ERROR NO_EVENT", -1));
    case CKR_NEED_TO_CREATE_THREADS:
      return(Tcl_NewStringObj("PKCS11_ERROR NEED_TO_CREATE_THREADS", -1));
    case CKR_CANT_LOCK:
      return(Tcl_NewStringObj("PKCS11_ERROR CANT_LOCK", -1));
    case CKR_ATTRIBUTE_READ_ONLY:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_READ_ONLY", -1));
    case CKR_ATTRIBUTE_SENSITIVE:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_SENSITIVE", -1));
    case CKR_ATTRIBUTE_TYPE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_TYPE_INVALID", -1));
    case CKR_ATTRIBUTE_VALUE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_VALUE_INVALID", -1));
    case CKR_DATA_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR DATA_INVALID", -1));
    case CKR_DATA_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR DATA_LEN_RANGE", -1));
    case CKR_DEVICE_ERROR:
      return(Tcl_NewStringObj("PKCS11_ERROR DEVICE_ERROR", -1));
    case CKR_DEVICE_MEMORY:
      return(Tcl_NewStringObj("PKCS11_ERROR DEVICE_MEMORY", -1));
    case CKR_DEVICE_REMOVED:
      return(Tcl_NewStringObj("PKCS11_ERROR DEVICE_REMOVED", -1));
    case CKR_ENCRYPTED_DATA_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR ENCRYPTED_DATA_INVALID", -1));
    case CKR_ENCRYPTED_DATA_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR ENCRYPTED_DATA_LEN_RANGE", -1));
    case CKR_FUNCTION_CANCELED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_CANCELED", -1));
    case CKR_FUNCTION_NOT_PARALLEL:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_NOT_PARALLEL", -1));
    case CKR_FUNCTION_NOT_SUPPORTED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_NOT_SUPPORTED", -1));
    case CKR_KEY_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_HANDLE_INVALID", -1));
    case CKR_KEY_SIZE_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_SIZE_RANGE", -1));
    case CKR_KEY_TYPE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_TYPE_INCONSISTENT", -1));
    case CKR_KEY_NOT_NEEDED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_NOT_NEEDED", -1));
    case CKR_KEY_CHANGED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_CHANGED", -1));
    case CKR_KEY_NEEDED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_NEEDED", -1));
    case CKR_KEY_INDIGESTIBLE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_INDIGESTIBLE", -1));
    case CKR_KEY_FUNCTION_NOT_PERMITTED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_FUNCTION_NOT_PERMITTED", -1));
    case CKR_KEY_NOT_WRAPPABLE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_NOT_WRAPPABLE", -1));
    case CKR_KEY_UNEXTRACTABLE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_UNEXTRACTABLE", -1));
    case CKR_MECHANISM_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR MECHANISM_INVALID", -1));
    case CKR_MECHANISM_PARAM_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR MECHANISM_PARAM_INVALID", -1));
    case CKR_OBJECT_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR OBJECT_HANDLE_INVALID", -1));
    case CKR_OPERATION_ACTIVE:
      return(Tcl_NewStringObj("PKCS11_ERROR OPERATION_ACTIVE", -1));
    case CKR_OPERATION_NOT_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR OPERATION_NOT_INITIALIZED", -1));
    case CKR_PIN_INCORRECT:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_INCORRECT", -1));
    case CKR_PIN_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_INVALID", -1));
    case CKR_PIN_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_LEN_RANGE", -1));
    case CKR_PIN_EXPIRED:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_EXPIRED", -1));
    case CKR_PIN_LOCKED:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_LOCKED", -1));
    case CKR_SESSION_CLOSED:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_CLOSED", -1));
    case CKR_SESSION_COUNT:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_COUNT", -1));
    case CKR_SESSION_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_HANDLE_INVALID", -1));
    case CKR_SESSION_PARALLEL_NOT_SUPPORTED:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_PARALLEL_NOT_SUPPORTED", -1));
    case CKR_SESSION_READ_ONLY:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_READ_ONLY", -1));
    case CKR_SESSION_EXISTS:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_EXISTS", -1));
    case CKR_SESSION_READ_ONLY_EXISTS:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_READ_ONLY_EXISTS", -1));
    case CKR_SESSION_READ_WRITE_SO_EXISTS:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_READ_WRITE_SO_EXISTS", -1));
    case CKR_SIGNATURE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SIGNATURE_INVALID", -1));
    case CKR_SIGNATURE_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR SIGNATURE_LEN_RANGE", -1));
    case CKR_TEMPLATE_INCOMPLETE:
      return(Tcl_NewStringObj("PKCS11_ERROR TEMPLATE_INCOMPLETE", -1));
    case CKR_TEMPLATE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR TEMPLATE_INCONSISTENT", -1));
    case CKR_TOKEN_NOT_PRESENT:
      return(Tcl_NewStringObj("PKCS11_ERROR TOKEN_NOT_PRESENT", -1));
    case CKR_TOKEN_NOT_RECOGNIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR TOKEN_NOT_RECOGNIZED", -1));
    case CKR_TOKEN_WRITE_PROTECTED:
      return(Tcl_NewStringObj("PKCS11_ERROR TOKEN_WRITE_PROTECTED", -1));
    case CKR_UNWRAPPING_KEY_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR UNWRAPPING_KEY_HANDLE_INVALID", -1));
    case CKR_UNWRAPPING_KEY_SIZE_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR UNWRAPPING_KEY_SIZE_RANGE", -1));
    case CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR UNWRAPPING_KEY_TYPE_INCONSISTENT", -1));
    case CKR_USER_ALREADY_LOGGED_IN:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_ALREADY_LOGGED_IN", -1));
    case CKR_USER_NOT_LOGGED_IN:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_NOT_LOGGED_IN", -1));
    case CKR_USER_PIN_NOT_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_PIN_NOT_INITIALIZED", -1));
    case CKR_USER_TYPE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_TYPE_INVALID", -1));
    case CKR_USER_ANOTHER_ALREADY_LOGGED_IN:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_ANOTHER_ALREADY_LOGGED_IN", -1));
    case CKR_USER_TOO_MANY_TYPES:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_TOO_MANY_TYPES", -1));
    case CKR_WRAPPED_KEY_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPED_KEY_INVALID", -1));
    case CKR_WRAPPED_KEY_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPED_KEY_LEN_RANGE", -1));
    case CKR_WRAPPING_KEY_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPING_KEY_HANDLE_INVALID", -1));
    case CKR_WRAPPING_KEY_SIZE_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPING_KEY_SIZE_RANGE", -1));
    case CKR_WRAPPING_KEY_TYPE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPING_KEY_TYPE_INCONSISTENT", -1));
    case CKR_RANDOM_SEED_NOT_SUPPORTED:
      return(Tcl_NewStringObj("PKCS11_ERROR RANDOM_SEED_NOT_SUPPORTED", -1));
    case CKR_RANDOM_NO_RNG:
      return(Tcl_NewStringObj("PKCS11_ERROR RANDOM_NO_RNG", -1));
    case CKR_DOMAIN_PARAMS_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR DOMAIN_PARAMS_INVALID", -1));
    case CKR_BUFFER_TOO_SMALL:
      return(Tcl_NewStringObj("PKCS11_ERROR BUFFER_TOO_SMALL", -1));
    case CKR_SAVED_STATE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SAVED_STATE_INVALID", -1));
    case CKR_INFORMATION_SENSITIVE:
      return(Tcl_NewStringObj("PKCS11_ERROR INFORMATION_SENSITIVE", -1));
    case CKR_STATE_UNSAVEABLE:
      return(Tcl_NewStringObj("PKCS11_ERROR STATE_UNSAVEABLE", -1));
    case CKR_CRYPTOKI_NOT_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR CRYPTOKI_NOT_INITIALIZED", -1));
    case CKR_CRYPTOKI_ALREADY_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR CRYPTOKI_ALREADY_INITIALIZED", -1));
    case CKR_MUTEX_BAD:
      return(Tcl_NewStringObj("PKCS11_ERROR MUTEX_BAD", -1));
    case CKR_MUTEX_NOT_LOCKED:
      return(Tcl_NewStringObj("PKCS11_ERROR MUTEX_NOT_LOCKED", -1));
    case CKR_NEW_PIN_MODE:
      return(Tcl_NewStringObj("PKCS11_ERROR NEW_PIN_MODE", -1));
    case CKR_NEXT_OTP:
      return(Tcl_NewStringObj("PKCS11_ERROR NEXT_OTP", -1));
    case CKR_FUNCTION_REJECTED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_REJECTED", -1));
    case CKR_VENDOR_DEFINED:
      return(Tcl_NewStringObj("PKCS11_ERROR VENDOR_DEFINED", -1));
  }

  return(Tcl_NewStringObj("PKCS11_ERROR UNKNOWN", -1));
}